

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

int __thiscall Fl_Table::move_cursor(Fl_Table *this,int R,int C,int shiftselect)

{
  int r2;
  int c2;
  int iVar1;
  int iVar2;
  int iVar3;
  int r3;
  
  r2 = this->select_row;
  c2 = this->select_col;
  iVar2 = R + r2 + (uint)(r2 == -1);
  iVar1 = C + c2 + (uint)(c2 == -1);
  iVar3 = 0;
  if (iVar2 < 1) {
    iVar2 = iVar3;
  }
  r3 = this->_rows + -1;
  if (iVar2 < this->_rows) {
    r3 = iVar2;
  }
  if (iVar1 < 1) {
    iVar1 = iVar3;
  }
  iVar2 = this->_cols + -1;
  if (iVar1 < this->_cols) {
    iVar2 = iVar1;
  }
  if ((r3 != r2) || (iVar2 != c2)) {
    damage_zone(this,this->current_row,this->current_col,r2,c2,r3,iVar2);
    this->select_row = r3;
    this->select_col = iVar2;
    if ((shiftselect == 0) || ((Fl::e_state._2_1_ & 1) == 0)) {
      this->current_row = r3;
      this->current_col = iVar2;
    }
    if ((r3 <= this->toprow) || (this->botrow <= r3)) {
      row_position(this,r3);
    }
    iVar3 = 1;
    if ((iVar2 <= this->leftcol) || (this->rightcol <= iVar2)) {
      col_position(this,iVar2);
    }
  }
  return iVar3;
}

Assistant:

int Fl_Table::move_cursor(int R, int C, int shiftselect) {
  if (select_row == -1) R++;
  if (select_col == -1) C++;
  R += select_row;
  C += select_col;
  if (R < 0) R = 0;
  if (R >= rows()) R = rows() - 1;
  if (C < 0) C = 0;
  if (C >= cols()) C = cols() - 1;
  if (R == select_row && C == select_col) return 0;
  damage_zone(current_row, current_col, select_row, select_col, R, C);
  select_row = R;
  select_col = C;
  if (!shiftselect || !Fl::event_state(FL_SHIFT)) {
    current_row = R;
    current_col = C;
  }
  if (R < toprow + 1 || R > botrow - 1) row_position(R);
  if (C < leftcol + 1 || C > rightcol - 1) col_position(C);
  return 1;
}